

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MD5Loader.cpp
# Opt level: O1

void __thiscall Assimp::MD5Importer::LoadMD5MeshFile(MD5Importer *this)

{
  aiString *pInput;
  aiVertexWeight **ppaVar1;
  int *piVar2;
  pointer pBVar3;
  float fVar4;
  float fVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  uint uVar10;
  pointer pcVar11;
  IOSystem *pIVar12;
  aiScene *paVar13;
  pointer pWVar14;
  aiVector3D *paVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  MeshDesc *pMVar23;
  pointer pBVar24;
  int iVar25;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  aiNode *paVar26;
  aiNode **ppaVar27;
  pointer pMVar28;
  aiMesh **ppaVar29;
  aiMaterial **ppaVar30;
  uint *puVar31;
  ulong uVar32;
  aiMesh *paVar33;
  aiVector3D *paVar34;
  void *__s;
  pointer pVVar35;
  aiBone **ppaVar36;
  aiBone *paVar37;
  aiVertexWeight *paVar38;
  Logger *pLVar39;
  ulong *puVar40;
  aiFace *paVar41;
  aiMaterial *this_00;
  char *pcVar42;
  runtime_error *this_01;
  uint uVar43;
  aiFace *paVar44;
  float *pfVar45;
  long lVar46;
  ulong uVar47;
  char *__s_00;
  MD5Importer *this_02;
  aiVector3D **ppaVar48;
  float fVar49;
  float fVar50;
  float fVar51;
  float fVar52;
  float fVar53;
  float fVar54;
  string pFile;
  MD5MeshParser meshParser;
  string name;
  MD5Parser parser;
  aiString temp;
  uint local_938;
  uint local_934;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_920;
  aiVector3D **local_900;
  MeshDesc *local_8f8;
  aiBone ***local_8f0;
  MD5MeshParser local_8e8;
  float local_8b8;
  float fStack_8b4;
  float fStack_8b0;
  float fStack_8ac;
  long *local_8a8;
  ulong local_8a0;
  long local_898 [2];
  ulong local_888;
  char *local_880;
  char *local_878;
  long local_870;
  pointer local_868;
  MD5Parser local_860;
  undefined1 local_838 [1028];
  uint local_434;
  undefined1 local_430 [1024];
  IOStream *file;
  
  local_920._M_dataplus._M_p = (pointer)&local_920.field_2;
  pcVar11 = (this->mFile)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_920,pcVar11,pcVar11 + (this->mFile)._M_string_length);
  std::__cxx11::string::append((char *)&local_920);
  pIVar12 = this->pIOHandler;
  local_838._0_8_ = local_838 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_838,"rb","");
  iVar25 = (*pIVar12->_vptr_IOSystem[4])(pIVar12,local_920._M_dataplus._M_p,local_838._0_8_);
  file = (IOStream *)CONCAT44(extraout_var,iVar25);
  if ((undefined1 *)local_838._0_8_ != local_838 + 0x10) {
    operator_delete((void *)local_838._0_8_,local_838._16_8_ + 1);
  }
  if ((file == (IOStream *)0x0) ||
     (iVar25 = (*file->_vptr_IOStream[6])(), CONCAT44(extraout_var_00,iVar25) == 0)) {
    pLVar39 = DefaultLogger::get();
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_838,
                   "Failed to access MD5MESH file: ",&local_920);
    Logger::warn(pLVar39,(char *)local_838._0_8_);
    if ((undefined1 *)local_838._0_8_ != local_838 + 0x10) {
      operator_delete((void *)local_838._0_8_,local_838._16_8_ + 1);
    }
  }
  else {
    this->bHadMD5Mesh = true;
    LoadFileIntoMemory(this,file);
    MD5::MD5Parser::MD5Parser(&local_860,this->mBuffer,this->fileSize);
    MD5::MD5MeshParser::MD5MeshParser(&local_8e8,&local_860.mSections);
    paVar26 = (aiNode *)operator_new(0x478);
    local_838._0_8_ = local_838 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_838,"<MD5_Root>","");
    aiNode::aiNode(paVar26,(string *)local_838);
    this->pScene->mRootNode = paVar26;
    if ((undefined1 *)local_838._0_8_ != local_838 + 0x10) {
      operator_delete((void *)local_838._0_8_,local_838._16_8_ + 1);
    }
    this->pScene->mRootNode->mNumChildren = 2;
    ppaVar27 = (aiNode **)operator_new__(0x10);
    this->pScene->mRootNode->mChildren = ppaVar27;
    paVar26 = (aiNode *)operator_new(0x478);
    aiNode::aiNode(paVar26);
    this->pScene->mRootNode->mChildren[1] = paVar26;
    (paVar26->mName).length = 0xf;
    builtin_strncpy((paVar26->mName).data,"<MD5_Hierarchy>",0x10);
    paVar26->mParent = this->pScene->mRootNode;
    AttachChilds_Mesh(this,-1,paVar26,&local_8e8.mJoints);
    paVar26 = (aiNode *)operator_new(0x478);
    aiNode::aiNode(paVar26);
    *this->pScene->mRootNode->mChildren = paVar26;
    (paVar26->mName).length = 10;
    builtin_strncpy((paVar26->mName).data,"<MD5_Mesh>",0xb);
    paVar26->mParent = this->pScene->mRootNode;
    for (pMVar28 = local_8e8.mMeshes.
                   super__Vector_base<Assimp::MD5::MeshDesc,_std::allocator<Assimp::MD5::MeshDesc>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        pMVar28 !=
        local_8e8.mMeshes.
        super__Vector_base<Assimp::MD5::MeshDesc,_std::allocator<Assimp::MD5::MeshDesc>_>._M_impl.
        super__Vector_impl_data._M_finish; pMVar28 = pMVar28 + 1) {
      if (((pMVar28->mFaces).super__Vector_base<aiFace,_std::allocator<aiFace>_>._M_impl.
           super__Vector_impl_data._M_start !=
           (pMVar28->mFaces).super__Vector_base<aiFace,_std::allocator<aiFace>_>._M_impl.
           super__Vector_impl_data._M_finish) &&
         ((pMVar28->mVertices).
          super__Vector_base<Assimp::MD5::VertexDesc,_std::allocator<Assimp::MD5::VertexDesc>_>.
          _M_impl.super__Vector_impl_data._M_start !=
          (pMVar28->mVertices).
          super__Vector_base<Assimp::MD5::VertexDesc,_std::allocator<Assimp::MD5::VertexDesc>_>.
          _M_impl.super__Vector_impl_data._M_finish)) {
        puVar31 = &this->pScene->mNumMaterials;
        *puVar31 = *puVar31 + 1;
      }
    }
    this->pScene->mNumMeshes = this->pScene->mNumMaterials;
    paVar13 = this->pScene;
    ppaVar29 = (aiMesh **)operator_new__((ulong)paVar13->mNumMeshes << 3);
    paVar13->mMeshes = ppaVar29;
    paVar13 = this->pScene;
    ppaVar30 = (aiMaterial **)operator_new__((ulong)paVar13->mNumMeshes << 3);
    paVar13->mMaterials = ppaVar30;
    uVar10 = this->pScene->mNumMeshes;
    paVar26->mNumMeshes = uVar10;
    puVar31 = (uint *)operator_new__((ulong)uVar10 << 2);
    paVar26->mMeshes = puVar31;
    if (paVar26->mNumMeshes != 0) {
      uVar32 = 0;
      do {
        paVar26->mMeshes[uVar32] = (uint)uVar32;
        uVar32 = uVar32 + 1;
      } while (uVar32 < paVar26->mNumMeshes);
    }
    if (local_8e8.mMeshes.
        super__Vector_base<Assimp::MD5::MeshDesc,_std::allocator<Assimp::MD5::MeshDesc>_>._M_impl.
        super__Vector_impl_data._M_start !=
        local_8e8.mMeshes.
        super__Vector_base<Assimp::MD5::MeshDesc,_std::allocator<Assimp::MD5::MeshDesc>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      local_938 = 0;
      local_8f8 = local_8e8.mMeshes.
                  super__Vector_base<Assimp::MD5::MeshDesc,_std::allocator<Assimp::MD5::MeshDesc>_>.
                  _M_impl.super__Vector_impl_data._M_finish;
      pMVar28 = local_8e8.mMeshes.
                super__Vector_base<Assimp::MD5::MeshDesc,_std::allocator<Assimp::MD5::MeshDesc>_>.
                _M_impl.super__Vector_impl_data._M_start;
      do {
        if (((pMVar28->mFaces).super__Vector_base<aiFace,_std::allocator<aiFace>_>._M_impl.
             super__Vector_impl_data._M_start !=
             (pMVar28->mFaces).super__Vector_base<aiFace,_std::allocator<aiFace>_>._M_impl.
             super__Vector_impl_data._M_finish) &&
           ((pMVar28->mVertices).
            super__Vector_base<Assimp::MD5::VertexDesc,_std::allocator<Assimp::MD5::VertexDesc>_>.
            _M_impl.super__Vector_impl_data._M_start !=
            (pMVar28->mVertices).
            super__Vector_base<Assimp::MD5::VertexDesc,_std::allocator<Assimp::MD5::VertexDesc>_>.
            _M_impl.super__Vector_impl_data._M_finish)) {
          paVar33 = (aiMesh *)operator_new(0x520);
          paVar33->mPrimitiveTypes = 0;
          paVar33->mNumVertices = 0;
          paVar33->mNumFaces = 0;
          local_900 = &paVar33->mVertices;
          this_02 = (MD5Importer *)((paVar33->mName).data + 1);
          memset(local_900,0,0xcc);
          paVar33->mBones = (aiBone **)0x0;
          paVar33->mMaterialIndex = 0;
          (paVar33->mName).length = 0;
          (paVar33->mName).data[0] = '\0';
          memset(this_02,0x1b,0x3ff);
          paVar33->mNumAnimMeshes = 0;
          paVar33->mAnimMeshes = (aiAnimMesh **)0x0;
          paVar33->mMethod = 0;
          (paVar33->mAABB).mMin.x = 0.0;
          (paVar33->mAABB).mMin.y = 0.0;
          (paVar33->mAABB).mMin.z = 0.0;
          (paVar33->mAABB).mMax.x = 0.0;
          (paVar33->mAABB).mMax.y = 0.0;
          (paVar33->mAABB).mMax.z = 0.0;
          paVar33->mTextureCoords[0] = (aiVector3D *)0x0;
          paVar33->mTextureCoords[1] = (aiVector3D *)0x0;
          paVar33->mTextureCoords[2] = (aiVector3D *)0x0;
          paVar33->mTextureCoords[3] = (aiVector3D *)0x0;
          paVar33->mTextureCoords[4] = (aiVector3D *)0x0;
          paVar33->mTextureCoords[5] = (aiVector3D *)0x0;
          paVar33->mTextureCoords[6] = (aiVector3D *)0x0;
          paVar33->mTextureCoords[7] = (aiVector3D *)0x0;
          paVar33->mNumUVComponents[0] = 0;
          paVar33->mNumUVComponents[1] = 0;
          paVar33->mNumUVComponents[2] = 0;
          paVar33->mNumUVComponents[3] = 0;
          paVar33->mNumUVComponents[4] = 0;
          paVar33->mNumUVComponents[5] = 0;
          paVar33->mNumUVComponents[6] = 0;
          paVar33->mNumUVComponents[7] = 0;
          paVar33->mColors[0] = (aiColor4D *)0x0;
          paVar33->mColors[1] = (aiColor4D *)0x0;
          paVar33->mColors[2] = (aiColor4D *)0x0;
          paVar33->mColors[3] = (aiColor4D *)0x0;
          paVar33->mColors[4] = (aiColor4D *)0x0;
          paVar33->mColors[5] = (aiColor4D *)0x0;
          paVar33->mColors[6] = (aiColor4D *)0x0;
          paVar33->mColors[7] = (aiColor4D *)0x0;
          this->pScene->mMeshes[local_938] = paVar33;
          paVar33->mPrimitiveTypes = 4;
          MakeDataUnique(this_02,pMVar28);
          __s_00 = (pMVar28->mShader).data;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_8a8,__s_00,(allocator<char> *)local_838);
          std::__cxx11::string::append((char *)&local_8a8);
          uVar32 = local_8a0;
          if (local_8a0 < 0x400) {
            (paVar33->mName).length = (ai_uint32)local_8a0;
            memcpy((paVar33->mName).data,local_8a8,local_8a0);
            (paVar33->mName).data[uVar32] = '\0';
          }
          uVar32 = (long)(pMVar28->mVertices).
                         super__Vector_base<Assimp::MD5::VertexDesc,_std::allocator<Assimp::MD5::VertexDesc>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)(pMVar28->mVertices).
                         super__Vector_base<Assimp::MD5::VertexDesc,_std::allocator<Assimp::MD5::VertexDesc>_>
                         ._M_impl.super__Vector_impl_data._M_start >> 4;
          paVar33->mNumVertices = (uint)uVar32;
          uVar47 = uVar32 & 0xffffffff;
          paVar34 = (aiVector3D *)operator_new__(uVar47 * 0xc);
          if (uVar47 != 0) {
            memset(paVar34,0,((uVar47 * 0xc - 0xc) / 0xc) * 0xc + 0xc);
          }
          *local_900 = paVar34;
          paVar34 = (aiVector3D *)operator_new__((uVar32 & 0xffffffff) * 0xc);
          if ((uint)uVar32 != 0) {
            memset(paVar34,0,((uVar47 * 0xc - 0xc) / 0xc) * 0xc + 0xc);
          }
          pBVar24 = local_8e8.mJoints.
                    super__Vector_base<Assimp::MD5::BoneDesc,_std::allocator<Assimp::MD5::BoneDesc>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
          pBVar3 = local_8e8.mJoints.
                   super__Vector_base<Assimp::MD5::BoneDesc,_std::allocator<Assimp::MD5::BoneDesc>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          paVar33->mTextureCoords[0] = paVar34;
          paVar33->mNumUVComponents[0] = 2;
          pVVar35 = (pMVar28->mVertices).
                    super__Vector_base<Assimp::MD5::VertexDesc,_std::allocator<Assimp::MD5::VertexDesc>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          if (pVVar35 !=
              (pMVar28->mVertices).
              super__Vector_base<Assimp::MD5::VertexDesc,_std::allocator<Assimp::MD5::VertexDesc>_>.
              _M_impl.super__Vector_impl_data._M_finish) {
            do {
              paVar34->x = (pVVar35->mUV).x;
              paVar34->y = 1.0 - (pVVar35->mUV).y;
              paVar34->z = 0.0;
              pVVar35 = pVVar35 + 1;
              paVar34 = paVar34 + 1;
            } while (pVVar35 !=
                     (pMVar28->mVertices).
                     super__Vector_base<Assimp::MD5::VertexDesc,_std::allocator<Assimp::MD5::VertexDesc>_>
                     ._M_impl.super__Vector_impl_data._M_finish);
          }
          lVar46 = (long)local_8e8.mJoints.
                         super__Vector_base<Assimp::MD5::BoneDesc,_std::allocator<Assimp::MD5::BoneDesc>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)local_8e8.mJoints.
                         super__Vector_base<Assimp::MD5::BoneDesc,_std::allocator<Assimp::MD5::BoneDesc>_>
                         ._M_impl.super__Vector_impl_data._M_start >> 2;
          uVar47 = lVar46 * 0x5bda93fc9916f6a5;
          uVar32 = lVar46 * 0x6f6a4ff2645bda94;
          local_888 = (ulong)local_938;
          __s = operator_new__(-(ulong)(uVar47 >> 0x3e != 0) | uVar32);
          memset(__s,0,uVar32);
          for (pVVar35 = (pMVar28->mVertices).
                         super__Vector_base<Assimp::MD5::VertexDesc,_std::allocator<Assimp::MD5::VertexDesc>_>
                         ._M_impl.super__Vector_impl_data._M_start;
              pVVar35 !=
              (pMVar28->mVertices).
              super__Vector_base<Assimp::MD5::VertexDesc,_std::allocator<Assimp::MD5::VertexDesc>_>.
              _M_impl.super__Vector_impl_data._M_finish; pVVar35 = pVVar35 + 1) {
            uVar10 = pVVar35->mFirstWeight;
            uVar32 = (ulong)uVar10;
            if (uVar10 < pVVar35->mNumWeights + uVar10) {
              lVar46 = uVar32 * 0x14 + 4;
              do {
                pWVar14 = (pMVar28->mWeights).
                          super__Vector_base<Assimp::MD5::WeightDesc,_std::allocator<Assimp::MD5::WeightDesc>_>
                          ._M_impl.super__Vector_impl_data._M_start;
                fVar49 = *(float *)((long)&pWVar14->mBone + lVar46);
                if ((1.1920929e-07 <= fVar49) || (fVar49 < -1.1920929e-07)) {
                  piVar2 = (int *)((long)__s + (ulong)*(uint *)((long)pWVar14 + lVar46 + -4) * 4);
                  *piVar2 = *piVar2 + 1;
                }
                uVar32 = uVar32 + 1;
                lVar46 = lVar46 + 0x14;
              } while (uVar32 < pVVar35->mNumWeights + uVar10);
            }
          }
          if (pBVar24 != pBVar3) {
            uVar32 = 0;
            do {
              if (*(int *)((long)__s + uVar32 * 4) != 0) {
                paVar33->mNumBones = paVar33->mNumBones + 1;
              }
              uVar32 = uVar32 + 1;
            } while ((uVar32 & 0xffffffff) <= uVar47 && uVar47 - (uVar32 & 0xffffffff) != 0);
          }
          if ((ulong)paVar33->mNumBones != 0) {
            ppaVar36 = (aiBone **)operator_new__((ulong)paVar33->mNumBones << 3);
            local_8f0 = &paVar33->mBones;
            *local_8f0 = ppaVar36;
            ppaVar48 = local_900;
            if (local_8e8.mJoints.
                super__Vector_base<Assimp::MD5::BoneDesc,_std::allocator<Assimp::MD5::BoneDesc>_>.
                _M_impl.super__Vector_impl_data._M_finish !=
                local_8e8.mJoints.
                super__Vector_base<Assimp::MD5::BoneDesc,_std::allocator<Assimp::MD5::BoneDesc>_>.
                _M_impl.super__Vector_impl_data._M_start) {
              uVar32 = 0;
              fVar49 = 1.4013e-45;
              local_934 = 0;
              local_880 = __s_00;
              do {
                local_8b8 = fVar49;
                if (*(int *)((long)__s + uVar32 * 4) != 0) {
                  paVar37 = (aiBone *)operator_new(0x460);
                  (paVar37->mName).length = 0;
                  (paVar37->mName).data[0] = '\0';
                  memset((paVar37->mName).data + 1,0x1b,0x3ff);
                  paVar37->mNumWeights = 0;
                  paVar37->mWeights = (aiVertexWeight *)0x0;
                  (paVar37->mOffsetMatrix).a1 = 1.0;
                  (paVar37->mOffsetMatrix).a2 = 0.0;
                  (paVar37->mOffsetMatrix).a3 = 0.0;
                  (paVar37->mOffsetMatrix).a4 = 0.0;
                  (paVar37->mOffsetMatrix).b1 = 0.0;
                  (paVar37->mOffsetMatrix).b2 = 1.0;
                  (paVar37->mOffsetMatrix).b3 = 0.0;
                  (paVar37->mOffsetMatrix).b4 = 0.0;
                  (paVar37->mOffsetMatrix).c1 = 0.0;
                  (paVar37->mOffsetMatrix).c2 = 0.0;
                  (paVar37->mOffsetMatrix).c3 = 1.0;
                  (paVar37->mOffsetMatrix).c4 = 0.0;
                  (paVar37->mOffsetMatrix).d1 = 0.0;
                  (paVar37->mOffsetMatrix).d2 = 0.0;
                  (paVar37->mOffsetMatrix).d3 = 0.0;
                  (paVar37->mOffsetMatrix).d4 = 1.0;
                  (*local_8f0)[local_934] = paVar37;
                  uVar10 = *(uint *)((long)__s + uVar32 * 4);
                  paVar37->mNumWeights = uVar10;
                  uVar47 = (ulong)uVar10 * 8;
                  paVar38 = (aiVertexWeight *)operator_new__(uVar47);
                  if ((ulong)uVar10 != 0) {
                    memset(paVar38,0,uVar47);
                  }
                  local_878 = (paVar37->mName).data;
                  paVar37->mWeights = paVar38;
                  local_870 = uVar32 * 0x4b4;
                  local_868 = local_8e8.mJoints.
                              super__Vector_base<Assimp::MD5::BoneDesc,_std::allocator<Assimp::MD5::BoneDesc>_>
                              ._M_impl.super__Vector_impl_data._M_start;
                  pBVar3 = local_8e8.mJoints.
                           super__Vector_base<Assimp::MD5::BoneDesc,_std::allocator<Assimp::MD5::BoneDesc>_>
                           ._M_impl.super__Vector_impl_data._M_start + uVar32;
                  uVar10 = (pBVar3->super_BaseJointDescription).mName.length;
                  if (0x3fe < uVar10) {
                    uVar10 = 0x3ff;
                  }
                  uVar32 = (ulong)uVar10;
                  local_838._0_4_ = uVar10;
                  memcpy(local_838 + 4,(pBVar3->super_BaseJointDescription).mName.data,uVar32);
                  local_838[uVar32 + 4] = 0;
                  (paVar37->mName).length = uVar10;
                  memcpy(local_878,local_838 + 4,uVar32);
                  __s_00 = local_880;
                  ppaVar48 = local_900;
                  (paVar37->mName).data[uVar32] = '\0';
                  fVar19 = (pBVar3->mInvTransform).a1;
                  fVar20 = (pBVar3->mInvTransform).a2;
                  fVar21 = (pBVar3->mInvTransform).a3;
                  fVar22 = (pBVar3->mInvTransform).a4;
                  fVar53 = (pBVar3->mInvTransform).b1;
                  fVar16 = (pBVar3->mInvTransform).b2;
                  fVar17 = (pBVar3->mInvTransform).b3;
                  fVar18 = (pBVar3->mInvTransform).b4;
                  fVar5 = (pBVar3->mInvTransform).c1;
                  fVar54 = (pBVar3->mInvTransform).c2;
                  fVar51 = (pBVar3->mInvTransform).c3;
                  fVar52 = (pBVar3->mInvTransform).c4;
                  fVar49 = (pBVar3->mInvTransform).d2;
                  fVar50 = (pBVar3->mInvTransform).d3;
                  fVar4 = (pBVar3->mInvTransform).d4;
                  (paVar37->mOffsetMatrix).d1 = (pBVar3->mInvTransform).d1;
                  (paVar37->mOffsetMatrix).d2 = fVar49;
                  (paVar37->mOffsetMatrix).d3 = fVar50;
                  (paVar37->mOffsetMatrix).d4 = fVar4;
                  (paVar37->mOffsetMatrix).c1 = fVar5;
                  (paVar37->mOffsetMatrix).c2 = fVar54;
                  (paVar37->mOffsetMatrix).c3 = fVar51;
                  (paVar37->mOffsetMatrix).c4 = fVar52;
                  (paVar37->mOffsetMatrix).b1 = fVar53;
                  (paVar37->mOffsetMatrix).b2 = fVar16;
                  (paVar37->mOffsetMatrix).b3 = fVar17;
                  (paVar37->mOffsetMatrix).b4 = fVar18;
                  (paVar37->mOffsetMatrix).a1 = fVar19;
                  (paVar37->mOffsetMatrix).a2 = fVar20;
                  (paVar37->mOffsetMatrix).a3 = fVar21;
                  (paVar37->mOffsetMatrix).a4 = fVar22;
                  pBVar3->mMap = local_934;
                  fVar49 = (pBVar3->mRotationQuat).x;
                  fVar50 = (pBVar3->mRotationQuat).y;
                  (pBVar3->mRotationQuatConverted).x = fVar49;
                  (pBVar3->mRotationQuatConverted).y = fVar50;
                  fVar4 = (pBVar3->mRotationQuat).z;
                  (pBVar3->mRotationQuatConverted).z = fVar4;
                  fVar49 = ((1.0 - fVar49 * fVar49) - fVar50 * fVar50) - fVar4 * fVar4;
                  fVar50 = 0.0;
                  if (0.0 <= fVar49) {
                    if (fVar49 < 0.0) {
                      fVar50 = sqrtf(fVar49);
                    }
                    else {
                      fVar50 = SQRT(fVar49);
                    }
                  }
                  *(float *)((long)&(local_868->mRotationQuatConverted).w + local_870) = -fVar50;
                  local_934 = local_934 + 1;
                }
                uVar32 = (ulong)(uint)local_8b8;
                uVar47 = ((long)local_8e8.mJoints.
                                super__Vector_base<Assimp::MD5::BoneDesc,_std::allocator<Assimp::MD5::BoneDesc>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                          (long)local_8e8.mJoints.
                                super__Vector_base<Assimp::MD5::BoneDesc,_std::allocator<Assimp::MD5::BoneDesc>_>
                                ._M_impl.super__Vector_impl_data._M_start >> 2) * 0x5bda93fc9916f6a5
                ;
                fVar49 = (float)((int)local_8b8 + 1);
              } while (uVar32 <= uVar47 && uVar47 - uVar32 != 0);
            }
            pVVar35 = (pMVar28->mVertices).
                      super__Vector_base<Assimp::MD5::VertexDesc,_std::allocator<Assimp::MD5::VertexDesc>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            if (pVVar35 !=
                (pMVar28->mVertices).
                super__Vector_base<Assimp::MD5::VertexDesc,_std::allocator<Assimp::MD5::VertexDesc>_>
                ._M_impl.super__Vector_impl_data._M_finish) {
              paVar34 = *ppaVar48;
              do {
                paVar34->x = 0.0;
                paVar34->y = 0.0;
                paVar34->z = 0.0;
                uVar10 = pVVar35->mFirstWeight;
                uVar32 = (ulong)uVar10;
                uVar43 = pVVar35->mNumWeights + uVar10;
                fVar49 = 0.0;
                if (uVar10 < uVar43) {
                  pfVar45 = &(pMVar28->mWeights).
                             super__Vector_base<Assimp::MD5::WeightDesc,_std::allocator<Assimp::MD5::WeightDesc>_>
                             ._M_impl.super__Vector_impl_data._M_start[uVar32].mWeight;
                  lVar46 = uVar43 - uVar32;
                  do {
                    fVar49 = fVar49 + *pfVar45;
                    pfVar45 = pfVar45 + 5;
                    lVar46 = lVar46 + -1;
                  } while (lVar46 != 0);
                }
                if ((fVar49 != 0.0) || (NAN(fVar49))) {
                  if (uVar10 < pVVar35->mNumWeights + uVar10) {
                    lVar46 = uVar32 * 0x14 + 0x10;
                    do {
                      pWVar14 = (pMVar28->mWeights).
                                super__Vector_base<Assimp::MD5::WeightDesc,_std::allocator<Assimp::MD5::WeightDesc>_>
                                ._M_impl.super__Vector_impl_data._M_start;
                      uVar47 = ((long)(pMVar28->mWeights).
                                      super__Vector_base<Assimp::MD5::WeightDesc,_std::allocator<Assimp::MD5::WeightDesc>_>
                                      ._M_impl.super__Vector_impl_data._M_finish - (long)pWVar14 >>
                               2) * -0x3333333333333333;
                      if (uVar47 < uVar32 || uVar47 - uVar32 == 0) {
                        this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
                        local_838._0_8_ = local_838 + 0x10;
                        std::__cxx11::string::_M_construct<char_const*>
                                  ((string *)local_838,"MD5MESH: Invalid weight index","");
                        std::runtime_error::runtime_error(this_01,(string *)local_838);
                        *(undefined ***)this_01 = &PTR__runtime_error_0082bce0;
                        __cxa_throw(this_01,&DeadlyImportError::typeinfo,
                                    std::runtime_error::~runtime_error);
                      }
                      fVar50 = *(float *)((long)pWVar14 + lVar46 + -0xc);
                      if ((1.1920929e-07 <= fVar50) || (fVar50 < -1.1920929e-07)) {
                        uVar43 = *(uint *)((long)pWVar14 + lVar46 + -0x10);
                        fVar4 = *(float *)((long)pWVar14 + lVar46 + -8);
                        fVar5 = *(float *)((long)pWVar14 + lVar46 + -4);
                        fVar54 = *(float *)((long)&pWVar14->mBone + lVar46);
                        uVar6 = local_8e8.mJoints.
                                super__Vector_base<Assimp::MD5::BoneDesc,_std::allocator<Assimp::MD5::BoneDesc>_>
                                ._M_impl.super__Vector_impl_data._M_start[uVar43].
                                mRotationQuatConverted.w;
                        uVar8 = local_8e8.mJoints.
                                super__Vector_base<Assimp::MD5::BoneDesc,_std::allocator<Assimp::MD5::BoneDesc>_>
                                ._M_impl.super__Vector_impl_data._M_start[uVar43].
                                mRotationQuatConverted.x;
                        uVar7 = local_8e8.mJoints.
                                super__Vector_base<Assimp::MD5::BoneDesc,_std::allocator<Assimp::MD5::BoneDesc>_>
                                ._M_impl.super__Vector_impl_data._M_start[uVar43].
                                mRotationQuatConverted.y;
                        uVar9 = local_8e8.mJoints.
                                super__Vector_base<Assimp::MD5::BoneDesc,_std::allocator<Assimp::MD5::BoneDesc>_>
                                ._M_impl.super__Vector_impl_data._M_start[uVar43].
                                mRotationQuatConverted.z;
                        fVar52 = (((float)uVar6 * 0.0 - fVar4 * (float)uVar8) - (float)uVar7 * fVar5
                                 ) - (float)uVar9 * fVar54;
                        local_8b8 = (float)uVar9 * fVar5;
                        fVar53 = ((float)uVar9 * fVar4 + (float)uVar6 * fVar5 + (float)uVar7 * 0.0)
                                 - (float)uVar8 * fVar54;
                        fVar51 = (fVar5 * (float)uVar8 + fVar54 * (float)uVar6 + (float)uVar9 * 0.0)
                                 - fVar4 * (float)uVar7;
                        fVar54 = ((float)uVar7 * fVar54 + (float)uVar6 * fVar4 + (float)uVar8 * 0.0)
                                 - local_8b8;
                        fVar4 = local_8e8.mJoints.
                                super__Vector_base<Assimp::MD5::BoneDesc,_std::allocator<Assimp::MD5::BoneDesc>_>
                                ._M_impl.super__Vector_impl_data._M_start[uVar43].mPositionXYZ.y;
                        fVar5 = local_8e8.mJoints.
                                super__Vector_base<Assimp::MD5::BoneDesc,_std::allocator<Assimp::MD5::BoneDesc>_>
                                ._M_impl.super__Vector_impl_data._M_start[uVar43].mPositionXYZ.z;
                        paVar34->x = (fVar51 * (float)uVar7 +
                                      (((float)uVar6 * fVar54 - fVar52 * (float)uVar8) -
                                      fVar53 * (float)uVar9) +
                                     local_8e8.mJoints.
                                     super__Vector_base<Assimp::MD5::BoneDesc,_std::allocator<Assimp::MD5::BoneDesc>_>
                                     ._M_impl.super__Vector_impl_data._M_start[uVar43].mPositionXYZ.
                                     x) * fVar50 + paVar34->x;
                        paVar34->y = (fVar54 * (float)uVar9 +
                                      (((float)uVar6 * fVar53 - fVar52 * (float)uVar7) -
                                      fVar51 * (float)uVar8) + fVar4) * fVar50 + paVar34->y;
                        paVar34->z = (fVar53 * (float)uVar8 +
                                      (((float)uVar6 * fVar51 - fVar52 * (float)uVar9) -
                                      fVar54 * (float)uVar7) + fVar5) * fVar50 + paVar34->z;
                        paVar15 = *ppaVar48;
                        paVar38 = (*local_8f0)
                                  [local_8e8.mJoints.
                                   super__Vector_base<Assimp::MD5::BoneDesc,_std::allocator<Assimp::MD5::BoneDesc>_>
                                   ._M_impl.super__Vector_impl_data._M_start[uVar43].mMap]->mWeights
                        ;
                        (*local_8f0)
                        [local_8e8.mJoints.
                         super__Vector_base<Assimp::MD5::BoneDesc,_std::allocator<Assimp::MD5::BoneDesc>_>
                         ._M_impl.super__Vector_impl_data._M_start[uVar43].mMap]->mWeights =
                             paVar38 + 1;
                        paVar38->mVertexId =
                             (int)((ulong)((long)paVar34 - (long)paVar15) >> 2) * -0x55555555;
                        paVar38->mWeight = fVar50 / fVar49;
                        fStack_8b4 = (float)uVar9;
                        fStack_8b0 = (float)uVar9;
                        fStack_8ac = (float)uVar9;
                      }
                      uVar32 = uVar32 + 1;
                      lVar46 = lVar46 + 0x14;
                    } while ((uint)uVar32 < pVVar35->mNumWeights + uVar10);
                  }
                }
                else {
                  pLVar39 = DefaultLogger::get();
                  Logger::error(pLVar39,"MD5MESH: The sum of all vertex bone weights is 0");
                }
                pVVar35 = pVVar35 + 1;
                paVar34 = paVar34 + 1;
              } while (pVVar35 !=
                       (pMVar28->mVertices).
                       super__Vector_base<Assimp::MD5::VertexDesc,_std::allocator<Assimp::MD5::VertexDesc>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
            }
            if (paVar33->mNumBones != 0) {
              uVar32 = 0;
              do {
                ppaVar1 = &paVar33->mBones[uVar32]->mWeights;
                *ppaVar1 = *ppaVar1 + -(ulong)paVar33->mBones[uVar32]->mNumWeights;
                uVar32 = uVar32 + 1;
              } while (uVar32 < paVar33->mNumBones);
            }
          }
          operator_delete__(__s);
          uVar32 = (long)(pMVar28->mFaces).super__Vector_base<aiFace,_std::allocator<aiFace>_>.
                         _M_impl.super__Vector_impl_data._M_finish -
                   (long)(pMVar28->mFaces).super__Vector_base<aiFace,_std::allocator<aiFace>_>.
                         _M_impl.super__Vector_impl_data._M_start >> 4;
          paVar33->mNumFaces = (uint)uVar32;
          uVar32 = uVar32 & 0xffffffff;
          puVar40 = (ulong *)operator_new__(uVar32 * 0x10 + 8);
          *puVar40 = uVar32;
          paVar41 = (aiFace *)(puVar40 + 1);
          if (uVar32 != 0) {
            paVar44 = paVar41;
            do {
              paVar44->mNumIndices = 0;
              paVar44->mIndices = (uint *)0x0;
              paVar44 = paVar44 + 1;
            } while (paVar44 != paVar41 + uVar32);
          }
          paVar33->mFaces = paVar41;
          if (paVar33->mNumFaces != 0) {
            lVar46 = 0;
            uVar32 = 0;
            do {
              *(undefined4 *)((long)&paVar33->mFaces->mNumIndices + lVar46) = 3;
              *(undefined8 *)((long)&paVar33->mFaces->mIndices + lVar46) =
                   *(undefined8 *)
                    ((long)&((pMVar28->mFaces).super__Vector_base<aiFace,_std::allocator<aiFace>_>.
                             _M_impl.super__Vector_impl_data._M_start)->mIndices + lVar46);
              *(undefined8 *)
               ((long)&((pMVar28->mFaces).super__Vector_base<aiFace,_std::allocator<aiFace>_>.
                        _M_impl.super__Vector_impl_data._M_start)->mIndices + lVar46) = 0;
              uVar32 = uVar32 + 1;
              lVar46 = lVar46 + 0x10;
            } while (uVar32 < paVar33->mNumFaces);
          }
          this_00 = (aiMaterial *)operator_new(0x10);
          pMVar23 = local_8f8;
          aiMaterial::aiMaterial(this_00);
          pInput = &pMVar28->mShader;
          this->pScene->mMaterials[local_888] = this_00;
          if ((pInput->length == 0) || (pcVar42 = strchr(__s_00,0x2e), pcVar42 != (char *)0x0)) {
            aiMaterial::AddProperty(this_00,pInput,"$tex.file",1,0);
            local_8e8.mMeshes.
            super__Vector_base<Assimp::MD5::MeshDesc,_std::allocator<Assimp::MD5::MeshDesc>_>.
            _M_impl.super__Vector_impl_data._M_finish = pMVar23;
          }
          else {
            uVar10 = pInput->length;
            if (0x3fe < pInput->length) {
              uVar10 = 0x3ff;
            }
            local_838._0_4_ = uVar10;
            memcpy(local_838 + 4,__s_00,(ulong)uVar10);
            local_838[(ulong)uVar10 + 4] = 0;
            aiString::Append((aiString *)local_838,"_local.tga");
            aiMaterial::AddProperty(this_00,(aiString *)local_838,"$tex.file",6,0);
            uVar10 = pInput->length;
            if (0x3fe < pInput->length) {
              uVar10 = 0x3ff;
            }
            uVar32 = (ulong)uVar10;
            local_434 = uVar10;
            memcpy(local_430,__s_00,uVar32);
            local_430[uVar32] = 0;
            local_838._0_4_ = uVar10;
            memcpy(local_838 + 4,local_430,uVar32);
            local_838[uVar32 + 4] = 0;
            aiString::Append((aiString *)local_838,"_s.tga");
            aiMaterial::AddProperty(this_00,(aiString *)local_838,"$tex.file",2,0);
            uVar10 = pInput->length;
            if (0x3fe < pInput->length) {
              uVar10 = 0x3ff;
            }
            uVar32 = (ulong)uVar10;
            local_434 = uVar10;
            memcpy(local_430,__s_00,uVar32);
            local_430[uVar32] = 0;
            local_838._0_4_ = uVar10;
            memcpy(local_838 + 4,local_430,uVar32);
            local_838[uVar32 + 4] = 0;
            aiString::Append((aiString *)local_838,"_d.tga");
            aiMaterial::AddProperty(this_00,(aiString *)local_838,"$tex.file",1,0);
            uVar10 = pInput->length;
            if (0x3fe < pInput->length) {
              uVar10 = 0x3ff;
            }
            uVar32 = (ulong)uVar10;
            local_434 = uVar10;
            memcpy(local_430,__s_00,uVar32);
            local_430[uVar32] = 0;
            local_838._0_4_ = uVar10;
            memcpy(local_838 + 4,local_430,uVar32);
            local_838[uVar32 + 4] = 0;
            aiString::Append((aiString *)local_838,"_h.tga");
            aiMaterial::AddProperty(this_00,(aiString *)local_838,"$tex.file",5,0);
            aiMaterial::AddProperty(this_00,pInput,"?mat.name",0,0);
            local_8e8.mMeshes.
            super__Vector_base<Assimp::MD5::MeshDesc,_std::allocator<Assimp::MD5::MeshDesc>_>.
            _M_impl.super__Vector_impl_data._M_finish = local_8f8;
          }
          paVar33->mMaterialIndex = local_938;
          if (local_8a8 != local_898) {
            operator_delete(local_8a8,local_898[0] + 1);
          }
          local_938 = local_938 + 1;
        }
        pMVar28 = pMVar28 + 1;
      } while (pMVar28 !=
               local_8e8.mMeshes.
               super__Vector_base<Assimp::MD5::MeshDesc,_std::allocator<Assimp::MD5::MeshDesc>_>.
               _M_impl.super__Vector_impl_data._M_finish);
    }
    if (local_8e8.mJoints.
        super__Vector_base<Assimp::MD5::BoneDesc,_std::allocator<Assimp::MD5::BoneDesc>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_8e8.mJoints.
                      super__Vector_base<Assimp::MD5::BoneDesc,_std::allocator<Assimp::MD5::BoneDesc>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_8e8.mJoints.
                            super__Vector_base<Assimp::MD5::BoneDesc,_std::allocator<Assimp::MD5::BoneDesc>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_8e8.mJoints.
                            super__Vector_base<Assimp::MD5::BoneDesc,_std::allocator<Assimp::MD5::BoneDesc>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    std::vector<Assimp::MD5::MeshDesc,_std::allocator<Assimp::MD5::MeshDesc>_>::~vector
              (&local_8e8.mMeshes);
    std::vector<Assimp::MD5::Section,_std::allocator<Assimp::MD5::Section>_>::~vector
              (&local_860.mSections);
  }
  if (file != (IOStream *)0x0) {
    (*file->_vptr_IOStream[1])();
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_920._M_dataplus._M_p != &local_920.field_2) {
    operator_delete(local_920._M_dataplus._M_p,local_920.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void MD5Importer::LoadMD5MeshFile ()
{
    std::string pFile = mFile + "md5mesh";
    std::unique_ptr<IOStream> file( pIOHandler->Open( pFile, "rb"));

    // Check whether we can read from the file
    if( file.get() == NULL || !file->FileSize())    {
        ASSIMP_LOG_WARN("Failed to access MD5MESH file: " + pFile);
        return;
    }
    bHadMD5Mesh = true;
    LoadFileIntoMemory(file.get());

    // now construct a parser and parse the file
    MD5::MD5Parser parser(mBuffer,fileSize);

    // load the mesh information from it
    MD5::MD5MeshParser meshParser(parser.mSections);

    // create the bone hierarchy - first the root node and dummy nodes for all meshes
    pScene->mRootNode = new aiNode("<MD5_Root>");
    pScene->mRootNode->mNumChildren = 2;
    pScene->mRootNode->mChildren = new aiNode*[2];

    // build the hierarchy from the MD5MESH file
    aiNode* pcNode = pScene->mRootNode->mChildren[1] = new aiNode();
    pcNode->mName.Set("<MD5_Hierarchy>");
    pcNode->mParent = pScene->mRootNode;
    AttachChilds_Mesh(-1,pcNode,meshParser.mJoints);

    pcNode = pScene->mRootNode->mChildren[0] = new aiNode();
    pcNode->mName.Set("<MD5_Mesh>");
    pcNode->mParent = pScene->mRootNode;

#if 0
    if (pScene->mRootNode->mChildren[1]->mNumChildren) /* start at the right hierarchy level */
        SkeletonMeshBuilder skeleton_maker(pScene,pScene->mRootNode->mChildren[1]->mChildren[0]);
#else

    // FIX: MD5 files exported from Blender can have empty meshes
    for (std::vector<MD5::MeshDesc>::const_iterator it  = meshParser.mMeshes.begin(),end = meshParser.mMeshes.end(); it != end;++it) {
        if (!(*it).mFaces.empty() && !(*it).mVertices.empty())
            ++pScene->mNumMaterials;
    }

    // generate all meshes
    pScene->mNumMeshes = pScene->mNumMaterials;
    pScene->mMeshes = new aiMesh*[pScene->mNumMeshes];
    pScene->mMaterials = new aiMaterial*[pScene->mNumMeshes];

    //  storage for node mesh indices
    pcNode->mNumMeshes = pScene->mNumMeshes;
    pcNode->mMeshes = new unsigned int[pcNode->mNumMeshes];
    for (unsigned int m = 0; m < pcNode->mNumMeshes;++m)
        pcNode->mMeshes[m] = m;

    unsigned int n = 0;
    for (std::vector<MD5::MeshDesc>::iterator it  = meshParser.mMeshes.begin(),end = meshParser.mMeshes.end(); it != end;++it) {
        MD5::MeshDesc& meshSrc = *it;
        if (meshSrc.mFaces.empty() || meshSrc.mVertices.empty())
            continue;

        aiMesh* mesh = pScene->mMeshes[n] = new aiMesh();
        mesh->mPrimitiveTypes = aiPrimitiveType_TRIANGLE;

        // generate unique vertices in our internal verbose format
        MakeDataUnique(meshSrc);

        std::string name( meshSrc.mShader.C_Str() );
        name += ".msh";
        mesh->mName = name;
        mesh->mNumVertices = (unsigned int) meshSrc.mVertices.size();
        mesh->mVertices = new aiVector3D[mesh->mNumVertices];
        mesh->mTextureCoords[0] = new aiVector3D[mesh->mNumVertices];
        mesh->mNumUVComponents[0] = 2;

        // copy texture coordinates
        aiVector3D* pv = mesh->mTextureCoords[0];
        for (MD5::VertexList::const_iterator iter =  meshSrc.mVertices.begin();iter != meshSrc.mVertices.end();++iter,++pv) {
            pv->x = (*iter).mUV.x;
            pv->y = 1.0f-(*iter).mUV.y; // D3D to OpenGL
            pv->z = 0.0f;
        }

        // sort all bone weights - per bone
        unsigned int* piCount = new unsigned int[meshParser.mJoints.size()];
        ::memset(piCount,0,sizeof(unsigned int)*meshParser.mJoints.size());

        for (MD5::VertexList::const_iterator iter =  meshSrc.mVertices.begin();iter != meshSrc.mVertices.end();++iter,++pv) {
            for (unsigned int jub = (*iter).mFirstWeight, w = jub; w < jub + (*iter).mNumWeights;++w)
            {
                MD5::WeightDesc& weightDesc = meshSrc.mWeights[w];
                /* FIX for some invalid exporters */
                if (!(weightDesc.mWeight < AI_MD5_WEIGHT_EPSILON && weightDesc.mWeight >= -AI_MD5_WEIGHT_EPSILON ))
                    ++piCount[weightDesc.mBone];
            }
        }

        // check how many we will need
        for (unsigned int p = 0; p < meshParser.mJoints.size();++p)
            if (piCount[p])mesh->mNumBones++;

        if (mesh->mNumBones) // just for safety
        {
            mesh->mBones = new aiBone*[mesh->mNumBones];
            for (unsigned int q = 0,h = 0; q < meshParser.mJoints.size();++q)
            {
                if (!piCount[q])continue;
                aiBone* p = mesh->mBones[h] = new aiBone();
                p->mNumWeights = piCount[q];
                p->mWeights = new aiVertexWeight[p->mNumWeights];
                p->mName = aiString(meshParser.mJoints[q].mName);
                p->mOffsetMatrix = meshParser.mJoints[q].mInvTransform;

                // store the index for later use
                MD5::BoneDesc& boneSrc = meshParser.mJoints[q];
                boneSrc.mMap = h++;

                // compute w-component of quaternion
                MD5::ConvertQuaternion( boneSrc.mRotationQuat, boneSrc.mRotationQuatConverted );
            }

            pv = mesh->mVertices;
            for (MD5::VertexList::const_iterator iter =  meshSrc.mVertices.begin();iter != meshSrc.mVertices.end();++iter,++pv) {
                // compute the final vertex position from all single weights
                *pv = aiVector3D();

                // there are models which have weights which don't sum to 1 ...
                ai_real fSum = 0.0;
                for (unsigned int jub = (*iter).mFirstWeight, w = jub; w < jub + (*iter).mNumWeights;++w)
                    fSum += meshSrc.mWeights[w].mWeight;
                if (!fSum) {
                    ASSIMP_LOG_ERROR("MD5MESH: The sum of all vertex bone weights is 0");
                    continue;
                }

                // process bone weights
                for (unsigned int jub = (*iter).mFirstWeight, w = jub; w < jub + (*iter).mNumWeights;++w)   {
                    if (w >= meshSrc.mWeights.size())
                        throw DeadlyImportError("MD5MESH: Invalid weight index");

                    MD5::WeightDesc& weightDesc = meshSrc.mWeights[w];
                    if ( weightDesc.mWeight < AI_MD5_WEIGHT_EPSILON && weightDesc.mWeight >= -AI_MD5_WEIGHT_EPSILON) {
                        continue;
                    }

                    const ai_real fNewWeight = weightDesc.mWeight / fSum;

                    // transform the local position into worldspace
                    MD5::BoneDesc& boneSrc = meshParser.mJoints[weightDesc.mBone];
                    const aiVector3D v = boneSrc.mRotationQuatConverted.Rotate (weightDesc.vOffsetPosition);

                    // use the original weight to compute the vertex position
                    // (some MD5s seem to depend on the invalid weight values ...)
                    *pv += ((boneSrc.mPositionXYZ+v)* (ai_real)weightDesc.mWeight);

                    aiBone* bone = mesh->mBones[boneSrc.mMap];
                    *bone->mWeights++ = aiVertexWeight((unsigned int)(pv-mesh->mVertices),fNewWeight);
                }
            }

            // undo our nice offset tricks ...
            for (unsigned int p = 0; p < mesh->mNumBones;++p) {
                mesh->mBones[p]->mWeights -= mesh->mBones[p]->mNumWeights;
            }
        }

        delete[] piCount;

        // now setup all faces - we can directly copy the list
        // (however, take care that the aiFace destructor doesn't delete the mIndices array)
        mesh->mNumFaces = (unsigned int)meshSrc.mFaces.size();
        mesh->mFaces = new aiFace[mesh->mNumFaces];
        for (unsigned int c = 0; c < mesh->mNumFaces;++c)   {
            mesh->mFaces[c].mNumIndices = 3;
            mesh->mFaces[c].mIndices = meshSrc.mFaces[c].mIndices;
            meshSrc.mFaces[c].mIndices = NULL;
        }

        // generate a material for the mesh
        aiMaterial* mat = new aiMaterial();
        pScene->mMaterials[n] = mat;

        // insert the typical doom3 textures:
        // nnn_local.tga  - normal map
        // nnn_h.tga      - height map
        // nnn_s.tga      - specular map
        // nnn_d.tga      - diffuse map
        if (meshSrc.mShader.length && !strchr(meshSrc.mShader.data,'.')) {

            aiString temp(meshSrc.mShader);
            temp.Append("_local.tga");
            mat->AddProperty(&temp,AI_MATKEY_TEXTURE_NORMALS(0));

            temp =  aiString(meshSrc.mShader);
            temp.Append("_s.tga");
            mat->AddProperty(&temp,AI_MATKEY_TEXTURE_SPECULAR(0));

            temp =  aiString(meshSrc.mShader);
            temp.Append("_d.tga");
            mat->AddProperty(&temp,AI_MATKEY_TEXTURE_DIFFUSE(0));

            temp =  aiString(meshSrc.mShader);
            temp.Append("_h.tga");
            mat->AddProperty(&temp,AI_MATKEY_TEXTURE_HEIGHT(0));

            // set this also as material name
            mat->AddProperty(&meshSrc.mShader,AI_MATKEY_NAME);
        }
        else {
            mat->AddProperty(&meshSrc.mShader, AI_MATKEY_TEXTURE_DIFFUSE(0));
        }
        mesh->mMaterialIndex = n++;
    }
#endif
}